

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevdevkeyboardmanager.cpp
# Opt level: O1

void __thiscall QEvdevKeyboardManager::addKeyboard(QEvdevKeyboardManager *this,QString *deviceNode)

{
  QLoggingCategory *pQVar1;
  undefined8 uVar2;
  long lVar3;
  pointer *__ptr;
  long in_FS_OFFSET;
  unique_ptr<QEvdevKeyboardHandler,_std::default_delete<QEvdevKeyboardHandler>_> keyboard;
  long *local_48;
  QObject local_40;
  undefined3 uStack_3f;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined8 uStack_34;
  undefined4 local_2c;
  char16_t *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = QtPrivateLogging::qLcEvdevKey();
  if (((pQVar1->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
    local_28 = (char16_t *)pQVar1->name;
    local_40 = (QObject)0x2;
    uStack_3f = 0;
    uStack_3c = 0;
    uStack_38 = 0;
    uStack_34 = 0;
    local_2c = 0;
    uVar2 = QString::utf16();
    QMessageLogger::debug((char *)&stack0xffffffffffffffc0,"Adding keyboard at %ls",uVar2);
  }
  local_40 = (QObject)0xaa;
  uStack_3f = 0xaaaaaa;
  uStack_3c = 0xaaaaaaaa;
  QEvdevKeyboardHandler::create
            ((QEvdevKeyboardHandler *)&stack0xffffffffffffffc0,deviceNode,&this->m_spec,
             &this->m_defaultKeymapFile);
  if (CONCAT44(uStack_3c,_local_40) == 0) {
    addKeyboard();
  }
  else {
    local_48 = (long *)CONCAT44(uStack_3c,_local_40);
    local_40 = (QObject)0x0;
    uStack_3f = 0;
    uStack_3c = 0;
    QtInputSupport::DeviceHandlerList<QEvdevKeyboardHandler>::add
              (&this->m_keyboards,deviceNode,
               (unique_ptr<QEvdevKeyboardHandler,_std::default_delete<QEvdevKeyboardHandler>_>)
               &local_48);
    if (local_48 != (long *)0x0) {
      (**(code **)(*local_48 + 0x20))();
    }
    local_48 = (long *)0x0;
    lVar3 = QGuiApplicationPrivate::inputDeviceManager();
    QInputDeviceManagerPrivate::setDeviceCount((DeviceType)*(undefined8 *)(lVar3 + 8),2);
  }
  if ((long *)CONCAT44(uStack_3c,_local_40) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT44(uStack_3c,_local_40) + 0x20))();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QEvdevKeyboardManager::addKeyboard(const QString &deviceNode)
{
    qCDebug(qLcEvdevKey, "Adding keyboard at %ls", qUtf16Printable(deviceNode));
    auto keyboard = QEvdevKeyboardHandler::create(deviceNode, m_spec, m_defaultKeymapFile);
    if (keyboard) {
        m_keyboards.add(deviceNode, std::move(keyboard));
        updateDeviceCount();
    } else {
        qWarning("Failed to open keyboard device %ls", qUtf16Printable(deviceNode));
    }
}